

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O2

InvokeResult __thiscall
anon_unknown.dwarf_711673::cmForEachFunctionBlocker::invoke
          (cmForEachFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *inStatus,cmMakefile *mf)

{
  cmListFileFunction *pcVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  short sVar5;
  cmListFileFunction *lff;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  cmExecutionStatus status;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  lff = (cmListFileFunction *)(this->super_cmFunctionBlocker)._vptr_cmFunctionBlocker;
  pcVar1 = (cmListFileFunction *)
           (this->super_cmFunctionBlocker).StartingContext.Name._M_dataplus._M_p;
  bVar3 = 1;
  sVar5 = 0;
  do {
    if (lff == pcVar1) break;
    cmExecutionStatus::cmExecutionStatus(&status,(cmMakefile *)inStatus);
    local_b8._M_engaged = false;
    cmMakefile::ExecuteCommand
              ((cmMakefile *)inStatus,lff,&status,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_b8);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_b8);
    if (status.ReturnInvoked == true) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,&status.Variables);
      cmExecutionStatus::SetReturnInvoked((cmExecutionStatus *)functions,&local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
LAB_0023dc17:
      sVar5 = 1;
LAB_0023dc1a:
      bVar4 = false;
    }
    else {
      if (status.BreakInvoked != false) goto LAB_0023dc17;
      if (status.ContinueInvoked != false) goto LAB_0023dc1a;
      bVar2 = cmSystemTools::GetFatalErrorOccurred();
      bVar4 = !bVar2;
      if (bVar2) {
        bVar3 = 0;
        sVar5 = 1;
      }
    }
    cmExecutionStatus::~cmExecutionStatus(&status);
    lff = lff + 1;
  } while (bVar4);
  return (InvokeResult)((ushort)bVar3 | sVar5 << 8);
}

Assistant:

auto cmForEachFunctionBlocker::invoke(
  std::vector<cmListFileFunction> const& functions,
  cmExecutionStatus& inStatus, cmMakefile& mf) -> InvokeResult
{
  InvokeResult result = { true, false };
  // Invoke all the functions that were collected in the block.
  for (cmListFileFunction const& func : functions) {
    cmExecutionStatus status(mf);
    mf.ExecuteCommand(func, status);
    if (status.GetReturnInvoked()) {
      inStatus.SetReturnInvoked(status.GetReturnVariables());
      result.Break = true;
      break;
    }
    if (status.GetBreakInvoked()) {
      result.Break = true;
      break;
    }
    if (status.GetContinueInvoked()) {
      break;
    }
    if (cmSystemTools::GetFatalErrorOccurred()) {
      result.Restore = false;
      result.Break = true;
      break;
    }
  }
  return result;
}